

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *value)

{
  ExtensionSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetString",CPPTYPE_STRING);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = MutableExtensionSet(this,message);
    ExtensionSet::SetString(this_00,*(int *)(field + 0x28),(FieldType)field[0x2c],value,field);
    return;
  }
  ppbVar1 = MutableField<std::__cxx11::string*>(this,message,field);
  pbVar3 = *ppbVar1;
  ppbVar2 = DefaultRaw<std::__cxx11::string_const*>(this,field);
  if (pbVar3 != *ppbVar2) {
    std::__cxx11::string::_M_assign((string *)*ppbVar1);
    return;
  }
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)pbVar3,(string *)value);
  *ppbVar1 = pbVar3;
  return;
}

Assistant:

void GeneratedMessageReflection::SetString(
    Message* message, const FieldDescriptor* field,
    const string& value) const {
  USAGE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(field->number(),
                                                   field->type(), value, field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        string** ptr = MutableField<string*>(message, field);
        if (*ptr == DefaultRaw<const string*>(field)) {
          *ptr = new string(value);
        } else {
          (*ptr)->assign(value);
        }
        break;
      }
    }
  }
}